

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::VacuumInfo::Deserialize(VacuumInfo *this,Deserializer *deserializer)

{
  VacuumOptions options;
  VacuumInfo *this_00;
  pointer pVVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::VacuumInfo_*,_false> local_28;
  
  options = Deserializer::ReadProperty<duckdb::VacuumOptions>(deserializer,200,"options");
  this_00 = (VacuumInfo *)operator_new(0x38);
  VacuumInfo(this_00,options);
  local_28._M_head_impl = this_00;
  pVVar1 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::operator->
                     ((unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>
                       *)&local_28);
  Deserializer::ReadPropertyWithDefault<bool>(deserializer,0xc9,"has_table",&pVVar1->has_table);
  pVVar1 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::operator->
                     ((unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>
                       *)&local_28);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>>
            (deserializer,0xca,"ref",&pVVar1->ref);
  pVVar1 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::operator->
                     ((unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>
                       *)&local_28);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0xcb,"columns",&pVVar1->columns);
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_28._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> VacuumInfo::Deserialize(Deserializer &deserializer) {
	auto options = deserializer.ReadProperty<VacuumOptions>(200, "options");
	auto result = duckdb::unique_ptr<VacuumInfo>(new VacuumInfo(options));
	deserializer.ReadPropertyWithDefault<bool>(201, "has_table", result->has_table);
	deserializer.ReadPropertyWithDefault<unique_ptr<TableRef>>(202, "ref", result->ref);
	deserializer.ReadPropertyWithDefault<vector<string>>(203, "columns", result->columns);
	return std::move(result);
}